

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::SimplifyRecurrentAddExpression
          (SENodeSimplifyImpl *this,SERecurrentNode *recurrent_expr)

{
  ScalarEvolutionAnalysis *pSVar1;
  Loop *pLVar2;
  pointer ppSVar3;
  uint32_t uVar4;
  SENodeSimplifyImpl *pSVar5;
  int iVar6;
  tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_> tVar7;
  SENode *pSVar8;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  _Var9;
  SENode *pSVar10;
  undefined4 extraout_var;
  long lVar11;
  anon_class_8_1_a7bde43c find_first_less_than;
  pointer ppSVar12;
  SENode *local_58;
  SENodeSimplifyImpl *local_50;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_48;
  SENode *local_40;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_38;
  
  local_40 = this->node_;
  local_50 = this;
  tVar7.super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       operator_new(0x48);
  pSVar1 = (recurrent_expr->super_SENode).parent_analysis_;
  pLVar2 = recurrent_expr->loop_;
  *(long *)((long)tVar7.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)tVar7.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar7.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10) = 0;
  *(ScalarEvolutionAnalysis **)
   ((long)tVar7.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x20) = pSVar1;
  uVar4 = SENode::NumberOfNodes;
  *(uint32_t *)
   ((long)tVar7.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x28) =
       SENode::NumberOfNodes + 1;
  *(undefined ***)
   tVar7.
   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
   super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl = &PTR_GetType_00939cb8;
  *(Loop **)((long)tVar7.
                   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                   .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x40) =
       pLVar2;
  pSVar8 = (SENode *)operator_new(0x30);
  (pSVar8->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar8->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar8->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar8->parent_analysis_ = pSVar1;
  SENode::NumberOfNodes = uVar4 + 2;
  pSVar8->unique_id_ = SENode::NumberOfNodes;
  pSVar8->_vptr_SENode = (_func_int **)&PTR_GetType_00939e28;
  local_58 = recurrent_expr->offset_;
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                    (0,0);
  std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
            (&pSVar8->children_,(const_iterator)_Var9._M_current,&local_58);
  ppSVar3 = (local_40->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar12 = (local_40->children_).
                  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar5 = local_50, ppSVar12 != ppSVar3;
      ppSVar12 = ppSVar12 + 1) {
    pSVar10 = *ppSVar12;
    iVar6 = (**pSVar10->_vptr_SENode)(pSVar10);
    if (iVar6 != 1) {
      (*pSVar8->_vptr_SENode[3])(pSVar8,pSVar10);
    }
  }
  pSVar10 = ScalarEvolutionAnalysis::SimplifyExpression(local_50->analysis_,pSVar8);
  iVar6 = (**pSVar10->_vptr_SENode)(pSVar10);
  if (iVar6 == 6) {
    local_48._M_head_impl = pSVar8;
    pSVar8 = ScalarEvolutionAnalysis::GetCachedOrAdd
                       (pSVar5->analysis_,
                        (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                         *)&local_48);
    recurrent_expr->offset_ = pSVar8;
    local_58 = pSVar8;
    iVar6 = (*(recurrent_expr->super_SENode)._vptr_SENode[4])(recurrent_expr);
    if (CONCAT44(extraout_var,iVar6) != 0) goto LAB_00604bc6;
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                      ((recurrent_expr->super_SENode).children_.
                       super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (recurrent_expr->super_SENode).children_.
                       super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pSVar8);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              (&(recurrent_expr->super_SENode).children_,(const_iterator)_Var9._M_current,&local_58)
    ;
    if (local_48._M_head_impl != (SENode *)0x0) {
      (*(local_48._M_head_impl)->_vptr_SENode[2])();
    }
    local_48._M_head_impl = (SENode *)0x0;
    pSVar8 = (SENode *)0x0;
  }
  else {
    *(SENode **)
     ((long)tVar7.
            super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
            .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x38) = pSVar10;
    local_58 = pSVar10;
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                      (0,0,pSVar10);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               ((long)tVar7.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8),
               (const_iterator)_Var9._M_current,&local_58);
  }
  pSVar10 = recurrent_expr->coefficient_;
  *(SENode **)
   ((long)tVar7.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x30) = pSVar10;
  local_58 = pSVar10;
  lVar11 = (**(code **)(*(long *)tVar7.
                                 super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                 .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl
                       + 0x20))
                     (tVar7.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl);
  pSVar5 = local_50;
  if (lVar11 == 0) {
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                      (*(long *)((long)tVar7.
                                       super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                       .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>.
                                       _M_head_impl + 8),
                       *(long *)((long)tVar7.
                                       super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                       .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>.
                                       _M_head_impl + 0x10),pSVar10);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               ((long)tVar7.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8),
               (const_iterator)_Var9._M_current,&local_58);
    local_38._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
    super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         tVar7.
         super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
         .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl;
    pSVar10 = ScalarEvolutionAnalysis::GetCachedOrAdd
                        (pSVar5->analysis_,
                         (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                          *)&local_38);
    if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
        local_38._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl != (SENode *)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                            .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl +
                  0x10))();
    }
    local_38._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
    super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)0x0
    ;
    if (pSVar8 != (SENode *)0x0) {
      (*pSVar8->_vptr_SENode[2])(pSVar8);
    }
    return pSVar10;
  }
LAB_00604bc6:
  __assert_fail("false && \"Trying to add a child node to a constant!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis_nodes.h"
                ,0x43,"virtual void spvtools::opt::SENode::AddChild(SENode *)");
}

Assistant:

SENode* SENodeSimplifyImpl::SimplifyRecurrentAddExpression(
    SERecurrentNode* recurrent_expr) {
  const std::vector<SENode*>& children = node_->GetChildren();

  std::unique_ptr<SERecurrentNode> recurrent_node{new SERecurrentNode(
      recurrent_expr->GetParentAnalysis(), recurrent_expr->GetLoop())};

  // Create and simplify the new offset node.
  std::unique_ptr<SENode> new_offset{
      new SEAddNode(recurrent_expr->GetParentAnalysis())};
  new_offset->AddChild(recurrent_expr->GetOffset());

  for (SENode* child : children) {
    if (child->GetType() != SENode::RecurrentAddExpr) {
      new_offset->AddChild(child);
    }
  }

  // Simplify the new offset.
  SENode* simplified_child = analysis_.SimplifyExpression(new_offset.get());

  // If the child can be simplified, add the simplified form otherwise, add it
  // via the usual caching mechanism.
  if (simplified_child->GetType() != SENode::CanNotCompute) {
    recurrent_node->AddOffset(simplified_child);
  } else {
    recurrent_expr->AddOffset(analysis_.GetCachedOrAdd(std::move(new_offset)));
  }

  recurrent_node->AddCoefficient(recurrent_expr->GetCoefficient());

  return analysis_.GetCachedOrAdd(std::move(recurrent_node));
}